

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O3

expected<idx2::brick_volume,_idx2::idx2_err_code> *
idx2::DecodeTask(expected<idx2::brick_volume,_idx2::idx2_err_code> *__return_storage_ptr__,
                idx2_file *Idx2,params *P,decode_data *D,decode_state Ds,grid OutGrid,f64 Tolerance,
                mmap_volume *OutVol,volume *OutVolMem)

{
  ulong *puVar1;
  dtype dVar2;
  out_mode oVar3;
  byte *pbVar4;
  byte *pbVar5;
  allocator *paVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  bitstream *pbVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  expected<idx2::brick_volume,_idx2::idx2_err_code> *peVar17;
  i64 iVar18;
  code *pcVar19;
  bool bVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  decode_data *Key;
  ulong *puVar24;
  grid *Grid2;
  char *__function;
  uint uVar25;
  long lVar26;
  ulong *puVar27;
  ushort uVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  byte *pbVar32;
  int iVar33;
  volume *this;
  uint uVar34;
  byte *pbVar35;
  brick_volume *pbVar36;
  uint uVar37;
  char Subband;
  int iVar38;
  char cVar39;
  idx2_file *piVar40;
  mmap_volume *pmVar41;
  v3i Brick3;
  brick_volume BrickVol;
  unique_lock<std::mutex> Lock_1;
  stream_cache Streams;
  iterator StreamIt;
  int E;
  grid SbGridNonExt;
  u64 BrickKey_1;
  chunk_cache ChunkCache;
  extent PGrid;
  i8 local_90d;
  undefined1 local_90c [44];
  ulong local_8e0;
  undefined8 local_8d8;
  uint local_8cc;
  uint local_8c8;
  undefined4 local_8c4;
  ulong local_8c0;
  ulong local_8b8;
  u64 local_8b0;
  int local_8a8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  long local_898;
  ulong local_890;
  ulong local_888;
  long local_880;
  ulong local_878;
  undefined7 local_870;
  idx2_err_code iStack_869;
  undefined7 uStack_868;
  params *local_860;
  byte *local_858;
  ulong local_850;
  brick_volume *local_848;
  uint local_83c;
  int local_838;
  int local_834;
  uint local_830;
  uint local_82c;
  int local_828;
  int local_824;
  uint local_820;
  uint local_81c;
  uint local_818;
  uint local_814;
  int local_810;
  int local_80c;
  expected<idx2::brick_volume,_idx2::idx2_err_code> *local_808;
  ulong local_800;
  ulong local_7f8;
  ulong local_7f0;
  ulong local_7e8;
  f64 local_7e0;
  undefined **local_7d8;
  brick_volume local_7d0;
  char local_790;
  mmap_volume *local_788;
  mmap_volume *local_780;
  ulong local_778;
  ulong local_770;
  ulong local_768;
  v3i *local_760;
  long local_758;
  ulong local_750;
  ulong local_748;
  ulong local_740;
  ulong local_738;
  decode_data *local_730;
  brick_volume local_728;
  volume local_6e8;
  u64 uStack_6c0;
  u64 uStack_6b8;
  ulong uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  u64 uStack_698;
  undefined8 uStack_690;
  hash_table<short,_idx2::bitstream> local_688;
  iterator local_658;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_600;
  expected<idx2::chunk_cache,_idx2::idx2_err_code> local_5f8;
  iterator local_548 [16];
  expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> local_348;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  grid local_2d8;
  long local_2b8;
  long local_2a0;
  bitstream local_270;
  volume local_238 [13];
  
  iVar33 = 1;
  iVar38 = 1;
  iVar15 = (int)Ds.Level;
  if (Ds.Level < '\x01') {
    iVar29 = 1;
  }
  else {
    iVar29 = 1;
    do {
      iVar29 = iVar29 * (Idx2->GroupBrick3).field_0.field_0.Z;
      iVar33 = (Idx2->GroupBrick3).field_0.field_0.X * iVar33;
      iVar38 = iVar38 * (Idx2->GroupBrick3).field_0.field_0.Y;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  local_778 = (ulong)(uint)((Idx2->BrickDims3).field_0.field_0.X * iVar33);
  local_768 = (ulong)(uint)(iVar38 * (Idx2->BrickDims3).field_0.field_0.Y);
  local_770 = (ulong)(uint)(iVar29 * (Idx2->BrickDims3).field_0.field_0.Z);
  local_6a8 = Ds.Brick3.field_0._0_8_;
  uStack_6a0 = Ds._72_8_;
  uStack_690 = Ds._88_8_;
  uStack_698 = Ds.Brick;
  local_6e8.Type = Ds.ParentBrick.Vol.Type;
  local_6e8._33_7_ = Ds.ParentBrick.Vol._33_7_;
  uStack_6c0 = Ds.ParentBrick.ExtentLocal.From;
  uStack_6b8 = Ds.ParentBrick.ExtentLocal.Dims;
  uStack_6b0._0_1_ = Ds.ParentBrick.NChildrenDecoded;
  uStack_6b0._1_1_ = Ds.ParentBrick.NChildrenMax;
  uStack_6b0._2_1_ = Ds.ParentBrick.Significant;
  uStack_6b0._3_1_ = Ds.ParentBrick.DoneDecoding;
  uStack_6b0._4_4_ = Ds.ParentBrick._60_4_;
  local_6e8.Buffer.Data = Ds.ParentBrick.Vol.Buffer.Data;
  local_6e8.Buffer.Bytes = Ds.ParentBrick.Vol.Buffer.Bytes;
  local_6e8.Buffer.Alloc = Ds.ParentBrick.Vol.Buffer.Alloc;
  local_6e8.Dims = Ds.ParentBrick.Vol.Dims;
  local_880 = (long)Ds.Level;
  local_860 = P;
  local_808 = __return_storage_ptr__;
  local_7e0 = Tolerance;
  local_788 = OutVol;
  local_780 = (mmap_volume *)OutVolMem;
  if (Mallocator()::Instance == '\0') {
    DecodeTask();
  }
  local_728.Vol.Buffer.Data = (byte *)0x0;
  local_728.Vol.Buffer.Bytes = 0;
  local_728.Vol.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  local_728.Vol.Dims = 0;
  local_728.Vol.Type = __Invalid__;
  local_728.ExtentLocal.From = 0;
  local_728.ExtentLocal.Dims = 0;
  local_728.NChildrenDecoded = '\0';
  local_728.NChildrenMax = '\0';
  local_728.Significant = false;
  local_728.DoneDecoding = false;
  local_760 = &Idx2->BrickDimsExt3;
  local_90c._4_8_ = Idx2;
  Resize(&local_728.Vol,local_760,float64,D->Alloc);
  lVar26 = (long)(local_728.Vol.Dims * 2) >> 0x2b;
  lVar23 = (long)(local_728.Vol.Dims << 0x16) >> 0x2b;
  if (lVar23 != 0 && (lVar26 != 0 && (local_728.Vol.Dims & 0x1fffff) != 0)) {
    memset(local_728.Vol.Buffer.Data,0,
           lVar26 * lVar23 * ((long)(local_728.Vol.Dims << 0x2b) >> 0x2b) * 8);
  }
  local_688.LogCapacity = 0;
  local_688.Alloc = (allocator *)0x0;
  local_688.Keys = (short *)0x0;
  local_688.Vals = (bitstream *)0x0;
  local_688.Stats = (bucket_status *)0x0;
  local_688.Size = 0;
  if (Mallocator()::Instance == '\0') {
    DecodeTask();
  }
  Init<short,idx2::bitstream>(&local_688,7,(allocator *)&Mallocator()::Instance);
  iVar18 = ((array<idx2::subband> *)(local_90c._4_8_ + 0xad8))->Size;
  lVar23 = local_880;
  piVar40 = (idx2_file *)local_90c._4_8_;
  if ((char)iVar18 == '\0') {
    local_8c0 = 0;
  }
  else {
    if ('\x0f' < (char)local_880) goto LAB_00188f72;
    local_838 = (int)local_880 + 1;
    local_83c = (uint)(char)local_838;
    uVar21 = 0;
    local_2f8 = 0x8000000000000000;
    uStack_2f0 = 0x8000000000000000;
    uStack_2e8 = 0x8000000000000000;
    uStack_2e0 = 0x8000000000000000;
    local_618 = 0xaaaaaaaaaaaaaaaa;
    uStack_610 = 0xaaaaaaaaaaaaaaaa;
    uStack_608 = 0xaaaaaaaaaaaaaaaa;
    uStack_600 = 0xaaaaaaaaaaaaaaaa;
    local_638 = 0x5555555555555556;
    uStack_630 = 0x5555555555555556;
    uStack_628 = 0x5555555555555556;
    uStack_620 = 0x5555555555555556;
    local_8c0 = 0;
    local_8d8 = 0;
    local_90c._20_8_ = D;
    do {
      if (((piVar40->DecodeSubbandMasks).Arr[lVar23] >> (uVar21 & 0x1f) & 1) != 0) {
        pbVar4 = (piVar40->Subbands).Buffer.Data;
        local_858 = pbVar4 + (long)(char)local_8d8 * 0x40;
        lVar23 = *(long *)(pbVar4 + (long)(char)local_8d8 * 0x40 + 8);
        uVar31 = (lVar23 << 0x2b) >> 0x2b;
        local_888 = lVar23 * 2 >> 0x2b;
        local_890 = (ulong)((lVar23 << 0x16) >> 0xb) >> 0x20;
        D = (decode_data *)local_90c._20_8_;
        if (((char)local_8d8 == '\0') && ((char)local_838 < piVar40->NLevels)) {
          local_8e0 = CONCAT71(local_8e0._1_7_,1 < (long)local_888);
          iVar33 = (int)local_6a8;
          local_8b0 = CONCAT44(local_8b0._4_4_,local_6a8._4_4_);
          local_90c._40_4_ = (int)uStack_6a0;
          Brick3.field_0._0_8_ =
               (long)(int)uStack_6a0 / (long)(piVar40->GroupBrick3).field_0.field_0.Z & 0xffffffff;
          Brick3.field_0._8_4_ =
               (int)((long)(int)local_6a8 / (long)(piVar40->GroupBrick3).field_0.field_0.X);
          GetLinearBrick((idx2 *)piVar40,(idx2_file *)(ulong)local_83c,Brick3.field_0._8_4_,Brick3);
          uVar10 = local_90c._40_4_;
          uVar37 = (int)((lVar23 << 0x2b) >> 0x2b) - (uint)(1 < (long)uVar31);
          uVar34 = (int)local_890 - (uint)(1 < (int)((lVar23 << 0x16) >> 0x2b));
          uVar21 = (int)local_888 - (uint)(byte)local_8e0;
          iVar15 = (int)local_8b0;
          local_548[0].Key = *(unsigned_long **)local_858;
          local_548[0].Ht = *(hash_table<unsigned_long,_idx2::brick_volume> **)(local_858 + 0x10);
          local_548[0].Val =
               (brick_volume *)
               ((ulong)(uVar21 & 0x1fffff) << 0x2a |
               (ulong)(uVar34 & 0x1fffff) << 0x15 | (ulong)(uVar37 & 0x1fffff));
          local_238[0].Buffer.Data =
               (byte *)((ulong)(((int)local_90c._40_4_ % (piVar40->GroupBrick3).field_0.field_0.Z) *
                                uVar21 & 0x1fffff) << 0x2a |
                       (ulong)(((int)local_8b0 % (piVar40->GroupBrick3).field_0.field_0.Y) * uVar34
                              & 0x1fffff) << 0x15 |
                       (ulong)((iVar33 % (piVar40->GroupBrick3).field_0.field_0.X) * uVar37 &
                              0x1fffff));
          local_238[0].Buffer.Bytes = (i64)local_548[0].Val;
          CopyExtentGrid<double,double>
                    ((extent *)local_238,&local_6e8,(grid *)local_548,&local_728.Vol);
          D = (decode_data *)local_90c._20_8_;
          if (((iVar33 == 0 && iVar15 == 0) && uVar10 == 0) &&
             ((local_860->OutMode != HashMap || ((uStack_6b0 & 0x10000) == 0)))) {
            Dealloc(&local_6e8);
          }
          lVar23 = *(long *)(local_858 + 8);
          local_888 = lVar23 * 2 >> 0x2b;
          uVar31 = (ulong)(uint)(((int)lVar23 << 0xb) >> 0xb);
          local_890 = (ulong)((lVar23 << 0x16) >> 0xb) >> 0x20;
          piVar40 = (idx2_file *)local_90c._4_8_;
        }
        uVar9 = uStack_690;
        Subband = (char)local_8d8;
        uStack_690._0_6_ = CONCAT15(Subband,(undefined5)uStack_690);
        uVar11 = uStack_690;
        iVar15 = (piVar40->BlockDims3).field_0.field_0.X;
        iVar33 = (piVar40->BlockDims3).field_0.field_0.Y;
        iVar38 = (piVar40->BlockDims3).field_0.field_0.Z;
        uVar16 = (long)((int)uVar31 + -1 + iVar15) / (long)iVar15;
        local_850 = uVar16 & 0xffffffff;
        uVar7 = (long)((int)local_890 + -1 + iVar33) / (long)iVar33;
        local_7e8 = uVar7 & 0xffffffff;
        uVar8 = (long)((int)local_888 + iVar38 + -1) / (long)iVar38;
        local_7f0 = uVar8 & 0xffffffff;
        iVar30 = (int)uVar16 * (int)uVar8 * (int)uVar7;
        local_8b0 = uStack_698;
        uStack_690._0_4_ = (int)uVar9;
        iVar29 = (int)uStack_690;
        uStack_690._4_1_ = SUB81(uVar9,4);
        cVar39 = uStack_690._4_1_;
        pbVar36 = (brick_volume *)(ulong)(uint)(int)uStack_690._4_1_;
        if ((Subband == '\0') && ((int)((int)uStack_690._4_1_ + 1U) < (int)piVar40->NLevels)) {
          iVar30 = iVar30 - (int)((long)((ulong)(uint)((int)local_888 >> 0x1f) << 0x20 |
                                        local_888 & 0xffffffff) / (long)iVar38) *
                            (int)((long)((ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 |
                                        uVar31 & 0xffffffff) / (long)iVar15) *
                            ((int)local_890 / iVar33);
        }
        local_810 = (int)Subband;
        local_848 = pbVar36;
        local_800 = uVar31;
        uStack_690 = uVar11;
        ParallelReadChunkExponents
                  (&local_348,(idx2_file *)local_90c._4_8_,D,uStack_698,cVar39,Subband);
        if (local_348.Ok == false) {
          local_7d0.Vol.Buffer.Data._0_1_ = local_348.field_1.Val.ChunkPos._0_1_;
          local_870 = local_348.field_1._1_7_;
          iStack_869 = local_348.field_1.Err.Code;
          uStack_868 = local_348.field_1._9_7_;
          local_7d0.Vol.Buffer.Data._1_7_ = local_348.field_1._1_7_;
          local_7d0.Vol.Buffer.Bytes._0_1_ = local_348.field_1.Err.Code;
          local_7d0.Vol.Buffer.Bytes._1_7_ = local_348.field_1._9_7_;
          local_790 = '\0';
          goto LAB_00188b85;
        }
        bVar13 = *(dtype *)(local_90c._4_8_ + 0x98) - int64;
        bVar14 = 0;
        if (bVar13 < 4) {
          bVar14 = (byte)*(undefined4 *)(&DAT_001bcb40 + (ulong)bVar13 * 4);
        }
        lVar23 = CONCAT71(local_348.field_1._9_7_,local_348.field_1.Err.Code);
        lVar26 = (long)(iVar30 * iVar29 << (bVar14 & 0x1f));
        local_878 = *(ulong *)(lVar23 + lVar26);
        local_688.Size = 0;
        if (local_688.LogCapacity != 0x3f) {
          memset(local_688.Stats,0,1L << ((byte)local_688.LogCapacity & 0x3f));
        }
        local_898 = lVar23 + lVar26;
        uVar37 = (int)local_850 - 1;
        uVar34 = (int)local_7e8 - 1;
        uVar21 = (int)local_7f0 - 1;
        uVar37 = (uVar37 * 0x100 & 0xffff | uVar37 * 0x10000 | uVar37 & 0xff) & 0x300f00f;
        uVar34 = (uVar34 * 0x100 & 0xffff | uVar34 * 0x10000 | uVar34 & 0xff) & 0x300f00f;
        uVar21 = (uVar21 * 0x100 & 0xffff | uVar21 * 0x10000 | uVar21 & 0xff) & 0x300f00f;
        local_814 = ((uVar21 << 4 | uVar21) & 0x30c30c3) * 0x14 & 0x24924924 |
                    ((uVar34 << 4 | uVar34) & 0x30c30c3) * 10 & 0x12492492 |
                    ((uVar37 << 4 | uVar37) & 0x30c30c3) * 5 & 0x9249249;
        local_8a8 = (int)local_848 + 1;
        uVar21 = 0;
        local_8c8 = 0;
        local_8cc = 0;
        uVar31 = local_850;
        lVar23 = local_880;
        piVar40 = (idx2_file *)local_90c._4_8_;
        do {
          uVar37 = (uVar21 & 0x9249249) >> 2 | uVar21 & 0x9249249;
          uVar34 = uVar37 & 0x30c30c3;
          uVar34 = (uVar34 >> 4 | uVar34) & 0x300f00f;
          uVar34 = (uVar37 >> 0x10 & 0x300 | uVar34 >> 8 | uVar34) & 0x3ff;
          if ((int)uVar31 <= (int)uVar34) {
LAB_00187b49:
            iVar15 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> iVar15 & 1) == 0; iVar15 = iVar15 + 1) {
              }
            }
            bVar14 = (char)iVar15 + 1;
            if (uVar21 == 0) {
              bVar14 = 0;
            }
            uVar21 = (uVar21 >> (bVar14 & 0x1f)) + 1 << (bVar14 & 0x1f);
            goto LAB_001889c8;
          }
          uVar37 = uVar21 >> 1 & 0x9249249;
          local_738 = (ulong)uVar37;
          local_740 = (ulong)(uVar37 >> 2);
          uVar37 = uVar37 + (uVar37 >> 2);
          uVar22 = uVar37 & 0x30c30c3;
          local_818 = (uVar22 >> 4 | uVar22) & 0x300f00f;
          local_81c = local_818 >> 8;
          uVar37 = (uVar37 >> 0x10 & 0x300 | local_81c | local_818) & 0x3ff;
          if ((int)local_7e8 <= (int)uVar37) goto LAB_00187b49;
          uVar22 = uVar21 >> 2 & 0x9249248;
          local_750 = (ulong)uVar22;
          local_748 = (ulong)(uVar21 & 0x24924924);
          uVar22 = (uVar21 & 0x24924924) + uVar22;
          uVar25 = uVar22 >> 2 & 0x30c30c3;
          local_820 = (uVar25 >> 4 | uVar25) & 0x300f00f;
          uVar22 = (uVar22 >> 0x12 & 0x300 | local_820 >> 8 | local_820) & 0x3ff;
          if ((int)local_7f0 <= (int)uVar22) goto LAB_00187b49;
          iVar15 = (piVar40->BlockDims3).field_0.field_0.X;
          local_8a0 = (piVar40->BlockDims3).field_0.field_0.Y;
          local_828 = uVar34 * iVar15;
          local_8a4 = (piVar40->BlockDims3).field_0.field_0.Z;
          iVar29 = (int)local_800 - local_828;
          iVar38 = (int)local_890 - uVar37 * local_8a0;
          iVar33 = (int)local_888 - uVar22 * local_8a4;
          local_90c._40_4_ = iVar15;
          if (iVar29 < iVar15) {
            local_90c._40_4_ = iVar29;
          }
          local_89c = local_8a0;
          if (iVar38 < local_8a0) {
            local_89c = iVar38;
          }
          local_824 = local_8a4;
          if (iVar33 < local_8a4) {
            local_824 = iVar33;
          }
          uVar34 = (uint)(1 < local_824) + (uint)(1 < local_89c) + (uint)(1 < (int)local_90c._40_4_)
          ;
          local_7f8 = (ulong)uVar34;
          uVar34 = 1 << (char)uVar34 * '\x02';
          local_90c._32_4_ = uVar21;
          local_82c = local_820 >> 8;
          memset(local_238,0,0x200);
          if (((((char)local_8d8 == '\0') && (local_8a8 < *(i8 *)(local_90c._4_8_ + 0x9e8))) &&
              (iVar15 <= iVar29)) && ((local_8a0 <= iVar38 && (local_8a4 <= iVar33))))
          goto LAB_00188994;
          dVar2 = *(dtype *)(local_90c._4_8_ + 0x98);
          if ((dVar2 < 10) && ((0x2c0U >> (dVar2 & 0x1f) & 1) != 0)) {
            if (0x30 < (int)local_8c8) {
              local_878 = *(ulong *)(local_898 + (ulong)(local_8c8 >> 3));
              local_898 = (ulong)(local_8c8 >> 3) + local_898;
              local_8c8 = local_8c8 & 7;
            }
            uVar28 = (ushort)(local_878 >> ((byte)local_8c8 & 0x3f)) &
                     (ushort)bitstream::Masks.Arr[0x10];
            local_8c8 = local_8c8 + 0x10;
            iVar15 = -0x3ff;
          }
          else {
            if (0x38 < (int)local_8c8) {
              local_878 = *(ulong *)(local_898 + (ulong)(local_8c8 >> 3));
              local_898 = (ulong)(local_8c8 >> 3) + local_898;
              local_8c8 = local_8c8 & 7;
            }
            uVar28 = (ushort)(local_878 >> ((byte)local_8c8 & 0x3f)) &
                     (ushort)bitstream::Masks.Arr[8];
            local_8c8 = local_8c8 + 8;
            iVar15 = -0x7f;
          }
          local_90d = '\0';
          switch(dVar2) {
          case int8:
          case uint8:
            local_90c._16_4_ = 0x38;
            break;
          case int16:
          case uint16:
            local_90c._16_4_ = 0x30;
            break;
          case int32:
          case uint32:
          case float32:
            local_90c._16_4_ = 0x20;
            break;
          case int64:
          case uint64:
          case float64:
            bVar20 = false;
            local_90c._16_4_ = 0;
            goto LAB_00187c36;
          default:
            local_90c._16_4_ = 0x40;
            bVar20 = true;
            goto LAB_00187c36;
          }
          bVar20 = false;
LAB_00187c36:
          if (((double)local_7e0 != 0.0) || (NAN((double)local_7e0))) {
            frexp((double)local_7e0,(int *)&local_5f8);
            local_90c._36_4_ = (int)local_5f8._vptr_expected;
            if ((int)local_5f8._vptr_expected < -0x3fd) {
              local_90c._36_4_ = -0x3fe;
            }
            local_90c._36_4_ = local_90c._36_4_ + -6;
          }
          else {
            local_90c._36_4_ = -0x405;
          }
          if (!bVar20) {
            local_830 = (uint)local_7f8 ^ 0x3f;
            local_730 = (decode_data *)(ulong)(uint)((short)uVar28 + iVar15);
            local_834 = (int)(short)((short)uVar28 + iVar15);
            local_90c._36_4_ = local_90c._36_4_ - local_834;
            local_80c = *(int *)(local_90c._4_8_ + 0x9f8);
            cVar39 = '?';
            iVar15 = 0x3f;
            local_8c4 = 0;
            Key = local_730;
            local_8e0 = (ulong)uVar34;
            do {
              iVar38 = (int)(short)((short)local_730 + (short)iVar15);
              iVar33 = iVar38 + 0x400;
              local_90c._0_2_ = (undefined2)(iVar33 / local_80c);
              iVar33 = iVar33 % local_80c;
              if (((double)local_7e0 != 0.0) || (NAN((double)local_7e0))) {
                frexp((double)local_7e0,(int *)&local_5f8);
                Key = (decode_data *)0xfffffc02;
                iVar29 = (int)local_5f8._vptr_expected;
                if ((int)local_5f8._vptr_expected < -0x3fd) {
                  iVar29 = -0x3fe;
                }
              }
              else {
                iVar29 = -0x3ff;
              }
              iVar38 = iVar38 - iVar29;
              if ((iVar38 < 0x39) && (iVar33 == 0)) break;
              Lookup<short,idx2::bitstream>
                        (&local_658,(idx2 *)&local_688,
                         (hash_table<short,_idx2::bitstream> *)local_90c,(short *)Key);
              if ((local_658.Ht)->Stats[local_658.Idx] != Occupied) {
                pbVar36 = local_848;
                ParallelReadChunk(&local_5f8,(idx2_file *)local_90c._4_8_,
                                  (decode_data *)local_90c._20_8_,local_8b0,(i8)local_848,
                                  (i8)local_810,local_90c._0_2_);
                if (local_5f8.Ok != true) {
                  local_870 = local_5f8.field_1._1_7_;
                  iStack_869 = local_5f8.field_1.Err.Code;
                  uStack_868 = local_5f8.field_1._9_7_;
                  local_7d0.Vol.Buffer.Data._0_1_ = local_5f8.field_1.Val.ChunkPos._0_1_;
                  local_7d0.Vol.Buffer.Data._1_7_ = local_5f8.field_1._1_7_;
                  local_7d0.Vol.Buffer.Bytes._0_1_ = local_5f8.field_1.Err.Code;
                  local_7d0.Vol.Buffer.Bytes._1_7_ = local_5f8.field_1._9_7_;
                  local_790 = '\0';
                  D = (decode_data *)local_90c._20_8_;
                  goto LAB_00188b85;
                }
                memcpy(&local_2d8,&local_5f8.field_1,0xa0);
                puVar24 = (ulong *)(local_2d8.super_extent.Dims + local_2b8 * 8);
                puVar27 = (ulong *)local_2d8.super_extent.Dims;
                while (puVar27 < puVar24) {
                  while( true ) {
                    puVar1 = (ulong *)((long)puVar27 +
                                      (((long)puVar24 - (long)puVar27 >> 3) -
                                       ((long)puVar24 - (long)puVar27 >> 0x3f) & 0xfffffffffffffffeU
                                      ) * 4);
                    if (local_8b0 <= *puVar1) break;
                    puVar27 = puVar1 + 1;
                    if (puVar24 <= puVar27) goto LAB_00187e4a;
                  }
                  puVar24 = puVar1;
                  if (*puVar1 <= local_8b0) break;
                }
LAB_00187e4a:
                iVar33 = *(int *)(local_2a0 +
                                 ((long)((long)puVar24 - local_2d8.super_extent.Dims) >> 1));
                Insert<short,idx2::bitstream>(&local_658,(short *)local_90c,&local_270);
                pbVar4 = ((local_658.Val)->Stream).Data;
                (local_658.Val)->BitPtr = pbVar4 + iVar33;
                (local_658.Val)->BitBuf = *(u64 *)(pbVar4 + iVar33);
                (local_658.Val)->BitPos = 0;
              }
              pbVar12 = local_658.Val;
              local_90c[3] = 0x38 < iVar38;
              pbVar4 = ((local_658.Val)->Stream).Data;
              pbVar5 = (local_658.Val)->BitPtr;
              uVar21 = (local_658.Val)->BitPos;
              local_8b8 = (ulong)uVar21;
              if ((int)local_90c._36_4_ < 8) {
                Decode<unsigned_long>
                          ((unsigned_long *)local_238,(int)local_8e0,iVar15,&local_90d,local_658.Val
                           ,false);
                pbVar32 = pbVar12->BitPtr;
                uVar21 = pbVar12->BitPos;
              }
              else {
                paVar6 = ((local_658.Val)->Stream).Alloc;
                local_5f8.field_1.Err.Code = (idx2_err_code)paVar6;
                local_5f8.field_1._9_7_ = (undefined7)((ulong)paVar6 >> 8);
                local_5f8._vptr_expected = (_func_int **)((local_658.Val)->Stream).Data;
                iVar18 = ((local_658.Val)->Stream).Bytes;
                local_5f8.field_1.Val.ChunkPos._0_1_ = (undefined1)iVar18;
                local_5f8.field_1._1_7_ = (undefined7)((ulong)iVar18 >> 8);
                uVar31 = (local_658.Val)->BitBuf;
                uVar37 = (uint)local_90d;
                pbVar32 = pbVar5;
                if ((int)uVar37 < 1) {
                  pbVar35 = (byte *)0x0;
                  uVar16 = local_8b8;
                }
                else {
                  uVar25 = 0x40 - uVar21;
                  uVar22 = uVar37;
                  if ((int)uVar25 < (int)uVar37) {
                    uVar22 = uVar25;
                  }
                  if (0x40 < (int)uVar22) {
LAB_00188f39:
                    __function = 
                    "t &idx2::stack_array<unsigned long, 65>::operator[](int) const [t = unsigned long, N = 65]"
                    ;
                    goto LAB_00188f4e;
                  }
                  pbVar35 = (byte *)(uVar31 >> ((byte)uVar21 & 0x3f) &
                                    bitstream::Masks.Arr[(int)uVar22]);
                  uVar22 = uVar22 + uVar21;
                  uVar16 = (ulong)uVar22;
                  iVar33 = uVar37 - uVar25;
                  if (iVar33 != 0 && (int)uVar25 <= (int)uVar37) {
                    if (0x40 < iVar33) goto LAB_00188f39;
                    local_758 = (long)((int)uVar22 >> 3);
                    uVar31 = *(ulong *)(pbVar5 + local_758);
                    pbVar35 = (byte *)((ulong)pbVar35 |
                                      (uVar31 >> (sbyte)(uVar22 & 7) & bitstream::Masks.Arr[iVar33])
                                      << ((byte)uVar25 & 0x3f));
                    uVar16 = (ulong)((uVar22 & 7) + iVar33);
                    pbVar32 = pbVar5 + local_758;
                  }
                }
                uVar21 = (uint)uVar16;
                uVar22 = uVar37;
                while ((int)uVar22 < (int)local_8e0) {
                  uVar22 = (uint)uVar16;
                  if (0x3f < (int)uVar22) {
                    uVar31 = *(ulong *)(pbVar32 + (uVar16 >> 3));
                    pbVar32 = pbVar32 + (uVar16 >> 3);
                    uVar22 = uVar22 & 7;
                  }
                  uVar21 = uVar22 + 1;
                  uVar16 = (ulong)uVar21;
                  if ((uVar31 >> ((byte)uVar22 & 0x3f) & bitstream::Masks.Arr[1]) == 0) break;
                  while( true ) {
                    uVar21 = (uint)uVar16;
                    bVar14 = (byte)uVar37;
                    if ((int)(uVar34 - 1) <= (int)(char)bVar14) break;
                    if (0x3f < (int)uVar21) {
                      uVar31 = *(ulong *)(pbVar32 + (uVar16 >> 3));
                      pbVar32 = pbVar32 + (uVar16 >> 3);
                      uVar21 = uVar21 & 7;
                    }
                    uVar16 = (ulong)(uVar21 + 1);
                    if ((uVar31 >> ((byte)uVar21 & 0x3f) & bitstream::Masks.Arr[1]) != 0) break;
                    uVar37 = (uint)(byte)(bVar14 + 1);
                  }
                  uVar21 = (uint)uVar16;
                  uVar37 = uVar37 + 1;
                  local_90d = (i8)uVar37;
                  pbVar35 = pbVar35 + (1L << (bVar14 & 0x3f));
                  uVar22 = (uint)local_90d;
                }
                (&local_238[0].Buffer.Data)[0x3f - iVar15] = pbVar35;
                ((local_658.Val)->Stream).Alloc = paVar6;
                ((local_658.Val)->Stream).Data = (byte *)local_5f8._vptr_expected;
                ((local_658.Val)->Stream).Bytes = iVar18;
                (local_658.Val)->BitPtr = pbVar32;
                (local_658.Val)->BitBuf = uVar31;
                (local_658.Val)->BitPos = uVar21;
              }
              LOCK();
              (((atomic<unsigned_long> *)(local_90c._20_8_ + 0x268))->
              super___atomic_base<unsigned_long>)._M_i =
                   (((atomic<unsigned_long> *)(local_90c._20_8_ + 0x268))->
                   super___atomic_base<unsigned_long>)._M_i +
                   ((long)(int)uVar21 - (long)(int)local_8b8) +
                   (long)(pbVar32 + ((long)pbVar4 - (long)(pbVar5 + (long)(pbVar12->Stream).Data)))
                   * 8;
              UNLOCK();
              local_8c4 = CONCAT31((int3)((uint)local_8c4 >> 8),(char)local_8c4 + local_90c[3]);
              cVar39 = cVar39 + -1;
              iVar15 = (int)cVar39;
              Key = (decode_data *)local_90c._20_8_;
            } while ((int)local_90c._16_4_ <= iVar15);
            uVar9 = local_90c._20_8_;
            D = (decode_data *)local_90c._20_8_;
            if ('\0' < (char)local_8c4) {
              if (7 < (int)local_90c._36_4_) {
                TransposeRecursive<unsigned_long>((unsigned_long *)local_238,(int)(char)local_8c4);
              }
              LOCK();
              (((atomic<long> *)(uVar9 + 0x278))->super___atomic_base<long>)._M_i =
                   (((atomic<long> *)(uVar9 + 0x278))->super___atomic_base<long>)._M_i + 1;
              UNLOCK();
              peVar17 = (expected<idx2::brick_volume,_idx2::idx2_err_code> *)
                        (*(code *)(&DAT_001bcb78 +
                                  *(int *)(&DAT_001bcb78 + (local_7f8 & 0xffffffff) * 4)))();
              return peVar17;
            }
          }
LAB_00188994:
          uVar21 = local_90c._32_4_ + 1;
          uVar31 = local_850;
          lVar23 = local_880;
          piVar40 = (idx2_file *)local_90c._4_8_;
LAB_001889c8:
        } while (uVar21 <= local_814);
        LOCK();
        (D->NInsignificantSubbands).super___atomic_base<long>._M_i =
             (D->NInsignificantSubbands).super___atomic_base<long>._M_i +
             (ulong)(byte)((byte)local_8cc ^ 1);
        UNLOCK();
        uVar21 = local_8cc & 0xff;
        if ((local_8c0 & 1) != 0) {
          uVar21 = 1;
        }
        local_8c0 = (ulong)uVar21;
        iVar18 = (piVar40->Subbands).Size;
      }
      cVar39 = (char)local_8d8 + '\x01';
      local_8d8 = CONCAT71((int7)((ulong)local_8d8 >> 8),cVar39);
      uVar21 = (uint)cVar39;
    } while ((int)(char)iVar18 != uVar21);
    local_8c0 = local_8c0 & 0xffffffffffffff01;
  }
  pbVar36 = &local_728;
  InverseCdf53(local_760,(int)uStack_690._4_1_,&piVar40->Subbands,&piVar40->TransformDetails,
               &pbVar36->Vol,(int)lVar23 + 1 == (int)piVar40->NLevels);
  local_7d0.Significant = SUB81(local_8c0,0);
  local_728.Significant = local_7d0.Significant;
  local_728.DoneDecoding = true;
  uVar10 = local_728._56_4_;
  local_7d0.Vol.Buffer.Data._0_1_ = SUB81(local_728.Vol.Buffer.Data,0);
  local_7d0.Vol.Buffer.Data._1_7_ = (undefined7)((ulong)local_728.Vol.Buffer.Data >> 8);
  local_7d0.Vol.Buffer.Bytes._0_1_ = (idx2_err_code)local_728.Vol.Buffer.Bytes;
  local_7d0.Vol.Buffer.Bytes._1_7_ = (undefined7)((ulong)local_728.Vol.Buffer.Bytes >> 8);
  local_7d0.Vol.Buffer.Alloc = local_728.Vol.Buffer.Alloc;
  local_7d0.Vol.Dims = local_728.Vol.Dims;
  local_7d0.Vol._33_7_ = local_728.Vol._33_7_;
  local_7d0.Vol.Type = local_728.Vol.Type;
  local_7d0.ExtentLocal.From = local_728.ExtentLocal.From;
  local_7d0.ExtentLocal.Dims = local_728.ExtentLocal.Dims;
  local_7d0.NChildrenDecoded = local_728.NChildrenDecoded;
  local_7d0.NChildrenMax = local_728.NChildrenMax;
  local_7d0.DoneDecoding = true;
  local_7d0._60_4_ = local_728._60_4_;
  local_790 = '\x01';
  local_728._56_4_ = uVar10;
LAB_00188b85:
  local_7d8 = &PTR__expected_001d0ab0;
  Dealloc<short,idx2::bitstream>(&local_688);
  if (local_790 == '\0') {
    local_808->_vptr_expected = (_func_int **)&PTR__expected_001d0ab0;
    (local_808->field_1).Val.Vol.Buffer.Data =
         (byte *)CONCAT71(local_7d0.Vol.Buffer.Data._1_7_,local_7d0.Vol.Buffer.Data._0_1_);
    (local_808->field_1).Val.Vol.Buffer.Bytes =
         CONCAT71(local_7d0.Vol.Buffer.Bytes._1_7_,(idx2_err_code)local_7d0.Vol.Buffer.Bytes);
    bVar20 = false;
    goto LAB_00188eb3;
  }
  lVar23 = (long)Ds.Level;
  if (lVar23 == 0) {
LAB_00188c92:
    local_238[0].Buffer.Data =
         (byte *)((ulong)((int)local_770 * Ds.Brick3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                 (ulong)((int)local_768 * Ds.Brick3.field_0.field_0.Y & 0x1fffff) << 0x15 |
                 (ulong)((int)local_778 * Ds.Brick3.field_0.field_0.X & 0x1fffff));
    pbVar36 = (brick_volume *)0x1fffff;
    local_238[0].Buffer.Bytes =
         (ulong)((((v3i *)(local_90c._4_8_ + 0x9c))->field_0).field_0.Z & 0x1fffff) << 0x2a |
         ((ulong)(uint)(((v3i *)(local_90c._4_8_ + 0x9c))->field_0).field_0.Y & 0x1fffff) << 0x15 |
         (ulong)(uint)(((v3i *)(local_90c._4_8_ + 0x9c))->field_0).field_0.X & 0x1fffff;
    Grid2 = (grid *)((1L << (Ds.Level & 0x3fU) & 0x1fffffU) * 0x40000200001);
    local_238[0].Buffer.Alloc = (allocator *)Grid2;
    Crop<idx2::grid,idx2::grid>((grid *)&local_5f8,(idx2 *)&OutGrid,(grid *)local_238,Grid2);
    Relative<idx2::grid,idx2::grid>(&local_2d8,(idx2 *)&local_5f8,(grid *)local_238,Grid2);
    oVar3 = local_860->OutMode;
    if (oVar3 < HashMap) {
      pmVar41 = local_780;
      if (oVar3 == RegularGridFile) {
        pmVar41 = local_788;
      }
      dVar2 = (pmVar41->Vol).Type;
      Relative<idx2::grid,idx2::grid>((grid *)local_548,(idx2 *)&local_5f8,&OutGrid,Grid2);
      if (dVar2 == float32) {
        pcVar19 = CopyGridGrid<double,float>;
      }
      else {
        pcVar19 = CopyGridGrid<double,double>;
      }
      (*pcVar19)(&local_2d8,&local_7d0,local_548,pmVar41);
      Dealloc(&local_7d0);
    }
    else {
      if (oVar3 == HashMap) {
        if (local_7d0.Significant == true) {
          local_348._vptr_expected = (_func_int **)((long)(int)Ds.Level + Ds.Brick * 0x10);
          local_6e8.Buffer.Data = (byte *)&D->BrickPoolMutex;
          local_6e8.Buffer.Bytes = local_6e8.Buffer.Bytes & 0xffffffffffffff00;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_6e8);
          local_6e8.Buffer.Bytes = CONCAT71(local_6e8.Buffer.Bytes._1_7_,1);
          Insert<unsigned_long,idx2::brick_volume>
                    (local_548,(idx2 *)&D->BrickPool,
                     (hash_table<unsigned_long,_idx2::brick_volume> *)&local_348,
                     (unsigned_long *)&local_7d0,pbVar36);
          this = &local_6e8;
          goto LAB_00188e4d;
        }
      }
      else if (oVar3 != NoOutput) goto LAB_00188e85;
      Dealloc(&local_7d0);
    }
  }
  else {
    if ('\x10' < Ds.Level) {
LAB_00188f72:
      __function = 
      "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]";
LAB_00188f4e:
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,__function);
    }
    if (((stack_array<unsigned_char,_16> *)(local_90c._4_8_ + 0xd0))->Arr[lVar23 + -1] == '\0')
    goto LAB_00188c92;
    if ((local_860->OutMode == HashMap) && (local_7d0.Significant == true)) {
      local_5f8._vptr_expected = (_func_int **)(Ds.Brick * 0x10 + lVar23);
      local_238[0].Buffer.Data = (byte *)&D->BrickPoolMutex;
      local_238[0].Buffer.Bytes = local_238[0].Buffer.Bytes & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_238);
      local_238[0].Buffer.Bytes = CONCAT71(local_238[0].Buffer.Bytes._1_7_,1);
      Insert<unsigned_long,idx2::brick_volume>
                (local_548,(idx2 *)&D->BrickPool,
                 (hash_table<unsigned_long,_idx2::brick_volume> *)&local_5f8,
                 (unsigned_long *)&local_7d0,pbVar36);
      this = local_238;
LAB_00188e4d:
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this);
    }
  }
LAB_00188e85:
  local_808->_vptr_expected = (_func_int **)&PTR__expected_001d0ab0;
  (local_808->field_1).Val.Vol.Buffer.Data =
       (byte *)CONCAT71(local_7d0.Vol.Buffer.Data._1_7_,local_7d0.Vol.Buffer.Data._0_1_);
  (local_808->field_1).Val.Vol.Buffer.Bytes =
       CONCAT71(local_7d0.Vol.Buffer.Bytes._1_7_,(idx2_err_code)local_7d0.Vol.Buffer.Bytes);
  (local_808->field_1).Val.Vol.Buffer.Alloc = local_7d0.Vol.Buffer.Alloc;
  (local_808->field_1).Val.Vol.Dims = local_7d0.Vol.Dims;
  *(dtype *)((long)&local_808->field_1 + 0x20) = local_7d0.Vol.Type;
  *(undefined7 *)((long)&local_808->field_1 + 0x21) = local_7d0.Vol._33_7_;
  (local_808->field_1).Val.ExtentLocal.From = local_7d0.ExtentLocal.From;
  (local_808->field_1).Val.ExtentLocal.Dims = local_7d0.ExtentLocal.Dims;
  *(ulong *)((long)&local_808->field_1 + 0x38) =
       CONCAT44(local_7d0._60_4_,
                CONCAT13(local_7d0.DoneDecoding,CONCAT12(local_7d0.Significant,local_7d0._56_2_)));
  bVar20 = true;
LAB_00188eb3:
  local_808->Ok = bVar20;
  return local_808;
}

Assistant:

expected<brick_volume, idx2_err_code>
DecodeTask(const idx2_file& Idx2,
           const params& P,
           decode_data* D,
           decode_state Ds,
           grid OutGrid,
           f64 Tolerance,
           mmap_volume* OutVol,
           volume* OutVolMem)
{
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Ds.Level);
  /* --------------- Decode the brick --------------- */
  auto Result = ParallelDecodeBrick(Idx2, P, D, Ds, Tolerance);
  if (!Result)
    return Error(Result);
  // Copy the samples out to the output buffer (or file)
  // The Idx2.DecodeSubbandMasks[Level - 1] == 0 means that no subbands on the next level
  // will be decoded, so we can now just copy the result out
  brick_volume& BVol = Value(Result);
  if (Ds.Level == 0 || Idx2.DecodeSubbandMasks[Ds.Level - 1] == 0)
  {
    grid BrickGrid(Ds.Brick3 * B3, Idx2.BrickDims3, v3i(1 << Ds.Level));
    grid OutBrickGrid = Crop(OutGrid, BrickGrid);
    grid BrickGridLocal = Relative(OutBrickGrid, BrickGrid);
    if (P.OutMode == params::out_mode::RegularGridFile ||
        P.OutMode == params::out_mode::RegularGridMem)
    {
      auto OutputVol =
        P.OutMode == params::out_mode::RegularGridFile ? &OutVol->Vol : OutVolMem;
      auto CopyFunc = OutputVol->Type == dtype::float32 ? (CopyGridGrid<f64, f32>)
                                                        : (CopyGridGrid<f64, f64>);
      CopyFunc(BrickGridLocal, BVol.Vol, Relative(OutBrickGrid, OutGrid), OutputVol);
      Dealloc(&BVol); // TODO: dealloc here or outside?
    }
    else if (P.OutMode == params::out_mode::HashMap)
    {
      if (!BVol.Significant)
      {
        Dealloc(&BVol);
      }
      else
      {
        u64 BrickKey = GetBrickKey(Ds.Level, Ds.Brick);
        std::unique_lock<std::mutex> Lock(D->BrickPoolMutex);
        Insert(&D->BrickPool.BrickTable, BrickKey, BVol);
      }
    }
    else if (P.OutMode == params::out_mode::NoOutput)
    {
      Dealloc(&BVol);
    }
  }
  else // not the finest level
  {
    if (P.OutMode == params::out_mode::HashMap)
    {
      if (BVol.Significant)
      {
        u64 BrickKey = GetBrickKey(Ds.Level, Ds.Brick);
        std::unique_lock<std::mutex> Lock(D->BrickPoolMutex);
        Insert(&D->BrickPool.BrickTable, BrickKey, BVol);
      }
    }
  }

  return Value(Result);
}